

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_StartConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  int iVar2;
  AActor *this;
  
  iVar1 = 0;
  if (arg0 == 0) {
    this = (AActor *)0x0;
  }
  else {
    for (this = AActor::TIDHash[arg0 & 0x7f]; (this != (AActor *)0x0 && (this->tid != arg0));
        this = this->inext) {
    }
  }
  iVar2 = 0;
  if ((((it != (AActor *)0x0) &&
       (((iVar2 = iVar1, this != (AActor *)0x0 && (it->player != (player_t *)0x0)) &&
        (it->player->mo == (APlayerPawn *)it)))) &&
      (((0 < it->health && (0 < this->health)) && (((this->flags4).Value & 0x8000) == 0)))) &&
     (this->Conversation != (FStrifeDialogueNode *)0x0)) {
    AActor::ConversationAnimation(this,0);
    iVar2 = 1;
    P_StartConversation(this,it,arg1 != 0,true);
  }
  return iVar2;
}

Assistant:

FUNC(LS_StartConversation)
// StartConversation (tid, facetalker)
{
	FActorIterator iterator (arg0);

	AActor *target = iterator.Next();

	// Nothing to talk to
	if (target == NULL)
	{
		return false;
	}
	
	// Only living players are allowed to start conversations
	if (it == NULL || it->player == NULL || it->player->mo != it || it->health<=0)
	{
		return false;
	}

	// Dead things can't talk.
	if (target->health <= 0)
	{
		return false;
	}
	// Fighting things don't talk either.
	if (target->flags4 & MF4_INCOMBAT)
	{
		return false;
	}
	if (target->Conversation != NULL)
	{
		// Give the NPC a chance to play a brief animation
		target->ConversationAnimation (0);
		P_StartConversation (target, it, !!arg1, true);
		return true;
	}
	return false;
}